

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

KeyNode * __thiscall
google::protobuf::internal::KeyMapBase<bool>::InsertOrReplaceNode
          (KeyMapBase<bool> *this,KeyNode *node)

{
  bool bVar1;
  map_index_t b;
  NodeBase *node_00;
  NodeAndBucket NVar2;
  
  NVar2 = FindHelper(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1),(TreeIterator *)0x0)
  ;
  node_00 = NVar2.node;
  b = NVar2.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar1) {
      b = BucketNumber(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1));
    }
    node_00 = (NodeBase *)0x0;
  }
  else {
    erase_no_destroy(this,b,(KeyNode *)node_00);
  }
  InsertUnique(this,b,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return (KeyNode *)node_00;
}

Assistant:

KeyNode* InsertOrReplaceNode(KeyNode* node) {
    KeyNode* to_erase = nullptr;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (p.node != nullptr) {
      erase_no_destroy(p.bucket, static_cast<KeyNode*>(p.node));
      to_erase = static_cast<KeyNode*>(p.node);
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return to_erase;
  }